

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__7,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  size_type in_R9;
  UntypedFormatSpecImpl format;
  Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args;
  ulong local_68;
  long local_60;
  undefined8 local_58;
  char *local_50;
  undefined8 local_48;
  code *local_40;
  undefined8 local_38;
  code *local_30;
  undefined8 *local_28;
  code *local_20;
  undefined1 *local_18;
  code *local_10;
  
  local_18 = (undefined1 *)&local_68;
  local_68 = (ulong)*(ushort *)(*(long *)(**(long **)this + 8) + 2);
  local_60 = ~local_68 + *(long *)(**(long **)this + 8);
  local_28 = &local_58;
  local_58 = 6;
  local_50 = "uint64";
  local_48 = 0;
  local_40 = str_format_internal::FormatArgImpl::Dispatch<unsigned_long>;
  local_38 = 0xffffffffffffffff;
  local_30 = str_format_internal::FormatArgImpl::Dispatch<unsigned_long>;
  local_20 = str_format_internal::FormatArgImpl::
             Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
  local_10 = str_format_internal::FormatArgImpl::
             Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
  format.size_ = (size_t)&local_48;
  format.data_ = (void *)0x39;
  args.len_ = in_R9;
  args.ptr_ = (pointer)0x4;
  str_format_internal::FormatPack_abi_cxx11_
            (__return_storage_ptr__,
             (str_format_internal *)"Value must be integer, from %d to %d, for %s option \"%s\".",
             format,args);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}